

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Gc::Gc(Gc *this)

{
  (this->m_threadMap).m_table.
  super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  .m_p = (AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
          *)0x0;
  (this->m_threadMap).m_table.
  super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  .m_hdr = (Hdr *)0x0;
  (this->m_threadMap).m_list.
  super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
  .
  super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
  .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_tail =
       (HashTableEntry<unsigned_long,_bool> *)0x0;
  (this->m_threadMap).m_list.
  super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
  .
  super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
  .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_count = 0;
  (this->m_threadArray).super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_count
       = 0;
  (this->m_threadMap).m_list.
  super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
  .
  super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
  .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head =
       (HashTableEntry<unsigned_long,_bool> *)0x0;
  (this->m_threadArray).super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p =
       (unsigned_long *)0x0;
  (this->m_threadArray).super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_hdr =
       (Hdr *)0x0;
  (this->m_guardPage).m_p = (void *)0x0;
  (this->m_guardPage).m_size = 0;
  (this->m_threadMap).m_table.
  super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  .m_count = 0;
  (this->m_threadMap).m_resizeThreshold = 0x4b;
  sem_init((sem_t *)&this->m_handshakeSem,0,0);
  axl::io::psx::Mapping::map(&this->m_guardPage,(void *)0x0,0x1000,3,0x22,-1,0);
  this->m_handshakeKind = HandshakeKind_None;
  installSignalHandlers(this);
  return;
}

Assistant:

Gc() {
		m_guardPage.map(
			NULL,
			4 * 1024, // typical page size -- OS will not give us less than that, anyway
			PROT_READ | PROT_WRITE,
			MAP_PRIVATE | MAP_ANON,
			-1,
			0
		);

		m_handshakeKind = HandshakeKind_None;
		installSignalHandlers();
	}